

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  uint uVar1;
  undefined8 uVar2;
  ImVec2 IVar3;
  ImDrawVert *pIVar4;
  int iVar5;
  ImVec2 IVar6;
  ulong uVar7;
  float *pfVar8;
  ulong uVar9;
  undefined8 *puVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  undefined7 in_register_00000081;
  ulong uVar16;
  uint *puVar17;
  uint uVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float afStack_78 [2];
  undefined8 uStack_70;
  ImVec2 local_68;
  ImVec2 IStack_60;
  ImVec2 local_58;
  ImVec2 IStack_50;
  undefined8 local_48;
  float *local_40;
  ImU32 local_34;
  
  if (points_count < 2) {
    return;
  }
  IVar3 = this->_Data->TexUvWhitePixel;
  local_58 = (ImVec2)(ulong)(points_count - 1U);
  local_40 = (float *)(ulong)(points_count - 1U);
  if (closed) {
    local_40 = (float *)(ulong)(uint)points_count;
  }
  iVar14 = (int)local_40;
  local_68.x = thickness;
  if ((this->Flags & 1) == 0) {
    uStack_70 = 0x14bf70;
    PrimReserve(this,iVar14 * 6,iVar14 * 4);
    for (uVar9 = 1; uVar9 - ((ulong)local_40 & 0xffffffff) != 1; uVar9 = uVar9 + 1) {
      uVar7 = uVar9 & 0xffffffff;
      if ((uint)points_count == uVar9) {
        uVar7 = 0;
      }
      fVar22 = points[uVar9 - 1].x;
      fVar24 = points[uVar9 - 1].y;
      fVar20 = points[uVar7].x - fVar22;
      fVar23 = points[uVar7].y - fVar24;
      fVar21 = fVar20 * fVar20 + fVar23 * fVar23;
      if (0.0 < fVar21) {
        fVar21 = 1.0 / SQRT(fVar21);
        fVar23 = fVar23 * fVar21;
        fVar20 = fVar20 * fVar21;
      }
      fVar23 = fVar23 * local_68.x * 0.5;
      fVar20 = fVar20 * local_68.x * 0.5;
      pIVar4 = this->_VtxWritePtr;
      IVar6.y = fVar24 - fVar20;
      IVar6.x = fVar22 + fVar23;
      pIVar4->pos = IVar6;
      pIVar4->uv = IVar3;
      pIVar4 = this->_VtxWritePtr;
      pIVar4->col = col;
      pIVar4[1].pos.x = points[uVar7].x + fVar23;
      pIVar4[1].pos.y = points[uVar7].y - fVar20;
      pIVar4[1].uv = IVar3;
      pIVar4 = this->_VtxWritePtr;
      pIVar4[1].col = col;
      pIVar4[2].pos.x = points[uVar7].x - fVar23;
      pIVar4[2].pos.y = points[uVar7].y + fVar20;
      pIVar4[2].uv = IVar3;
      pIVar4 = this->_VtxWritePtr;
      pIVar4[2].col = col;
      pIVar4[3].pos.x = points[uVar9 - 1].x - fVar23;
      pIVar4[3].pos.y = points[uVar9 - 1].y + fVar20;
      pIVar4[3].uv = IVar3;
      pIVar4 = this->_VtxWritePtr;
      pIVar4[3].col = col;
      this->_VtxWritePtr = pIVar4 + 4;
      uVar18 = this->_VtxCurrentIdx;
      puVar17 = this->_IdxWritePtr;
      *puVar17 = uVar18;
      puVar17[1] = uVar18 + 1;
      puVar17[2] = this->_VtxCurrentIdx + 2;
      uVar18 = this->_VtxCurrentIdx;
      puVar17[3] = uVar18;
      puVar17[4] = uVar18 + 2;
      puVar17[5] = this->_VtxCurrentIdx + 3;
      this->_IdxWritePtr = puVar17 + 6;
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + 4;
    }
    return;
  }
  local_34 = (ImU32)CONCAT71(in_register_00000081,closed);
  local_48 = (ulong)(1.0 < thickness);
  iVar5 = 0xc;
  if (1.0 < thickness) {
    iVar5 = 0x12;
  }
  IStack_50.y = (float)(points_count * 3);
  if (1.0 < thickness) {
    IStack_50.y = (float)(points_count * 4);
  }
  uStack_70 = 0x14c134;
  PrimReserve(this,iVar5 * iVar14,(int)IStack_50.y);
  lVar13 = -((ulong)(uint)(((int)local_48 * 2 + 3) * points_count) * 8 + 0xf & 0xfffffffffffffff0);
  puVar10 = (undefined8 *)((long)&local_68 + lVar13);
  uVar7 = (ulong)(uint)points_count;
  lVar12 = -((ulong)local_40 & 0xffffffff);
  *(undefined8 *)((long)&uStack_70 + lVar13) = 1;
  for (uVar9 = *(ulong *)((long)&uStack_70 + lVar13); lVar12 + uVar9 != 1; uVar9 = uVar9 + 1) {
    uVar16 = uVar9 & 0xffffffff;
    if (uVar7 == uVar9) {
      uVar16 = 0;
    }
    fVar23 = points[uVar16].x - points[uVar9 - 1].x;
    fVar20 = points[uVar16].y - points[uVar9 - 1].y;
    fVar22 = fVar23 * fVar23 + fVar20 * fVar20;
    if (0.0 < fVar22) {
      fVar22 = 1.0 / SQRT(fVar22);
      fVar23 = fVar23 * fVar22;
      fVar20 = fVar20 * fVar22;
    }
    *(float *)((long)&uStack_70 + uVar9 * 8 + lVar13) = fVar20;
    *(float *)((long)&uStack_70 + uVar9 * 8 + lVar13 + 4) = -fVar23;
  }
  pfVar8 = (float *)(puVar10 + uVar7);
  local_40 = pfVar8;
  local_48 = CONCAT44(local_48._4_4_,col) & 0xffffffff00ffffff;
  if ((char)local_34 == '\0') {
    *(undefined8 *)(pfVar8 + -2) = *(undefined8 *)(pfVar8 + -4);
    if (local_68.x <= 1.0) {
      fVar23 = (float)*puVar10;
      fVar20 = (float)((ulong)*puVar10 >> 0x20);
      fVar22 = (*points).x;
      fVar24 = (*points).y;
      *pfVar8 = fVar23 + fVar22;
      pfVar8[1] = fVar20 + fVar24;
      pfVar8[2] = fVar22 - fVar23;
      pfVar8[3] = fVar24 - fVar20;
      uVar9 = (ulong)local_58 & 0xffffffff;
      fVar23 = points[uVar9].x;
      fVar20 = points[uVar9].y;
      uVar16 = (ulong)(uint)((int)local_58.x * 2);
      *(ulong *)(pfVar8 + uVar16 * 2) =
           CONCAT44((float)((ulong)puVar10[uVar9] >> 0x20) + fVar20,(float)puVar10[uVar9] + fVar23);
      *(ulong *)(pfVar8 + uVar16 * 2 + 2) =
           CONCAT44(fVar20 - (float)((ulong)puVar10[uVar9] >> 0x20),fVar23 - (float)puVar10[uVar9]);
      goto LAB_0014c517;
    }
    local_34 = col;
    fVar28 = (local_68.x + -1.0) * 0.5;
    fVar23 = fVar28 + 1.0;
    fVar20 = (float)*puVar10;
    fVar22 = (float)((ulong)*puVar10 >> 0x20);
    fVar24 = fVar20 * fVar23;
    fVar21 = fVar22 * fVar23;
    fVar25 = (*points).x;
    fVar26 = (*points).y;
    fVar20 = fVar20 * fVar28;
    fVar22 = fVar22 * fVar28;
    *pfVar8 = fVar24 + fVar25;
    pfVar8[1] = fVar21 + fVar26;
    pfVar8[2] = fVar20 + fVar25;
    pfVar8[3] = fVar22 + fVar26;
    pfVar8[4] = fVar25 - fVar20;
    pfVar8[5] = fVar26 - fVar22;
    pfVar8[6] = fVar25 - fVar24;
    pfVar8[7] = fVar26 - fVar21;
    uVar9 = (ulong)local_58 & 0xffffffff;
    fVar20 = points[uVar9].x;
    fVar22 = points[uVar9].y;
    uVar16 = (ulong)(uint)((int)local_58.x << 2);
    *(ulong *)(pfVar8 + uVar16 * 2) =
         CONCAT44((float)((ulong)puVar10[uVar9] >> 0x20) * fVar23 + fVar22,
                  (float)puVar10[uVar9] * fVar23 + fVar20);
    *(ulong *)(pfVar8 + uVar16 * 2 + 2) =
         CONCAT44((float)((ulong)puVar10[uVar9] >> 0x20) * fVar28 + fVar22,
                  (float)puVar10[uVar9] * fVar28 + fVar20);
    *(ulong *)(pfVar8 + uVar16 * 2 + 4) =
         CONCAT44(fVar22 - (float)((ulong)puVar10[uVar9] >> 0x20) * fVar28,
                  fVar20 - (float)puVar10[uVar9] * fVar28);
    *(ulong *)(pfVar8 + uVar16 * 2 + 6) =
         CONCAT44(fVar22 - (float)((ulong)puVar10[uVar9] >> 0x20) * fVar23,
                  fVar20 - (float)puVar10[uVar9] * fVar23);
  }
  else {
    if (local_68.x <= 1.0) {
LAB_0014c517:
      uVar18 = this->_VtxCurrentIdx;
      puVar17 = this->_IdxWritePtr;
      *(undefined8 *)((long)&uStack_70 + lVar13) = 1;
      for (uVar9 = *(ulong *)((long)&uStack_70 + lVar13); lVar12 + uVar9 != 1; uVar9 = uVar9 + 1) {
        uVar16 = uVar9 & 0xffffffff;
        if (uVar7 == uVar9) {
          uVar16 = 0;
        }
        uVar19 = uVar18 + 3;
        if (uVar7 == uVar9) {
          uVar19 = this->_VtxCurrentIdx;
        }
        uVar2 = *(undefined8 *)((long)&uStack_70 + uVar9 * 8 + lVar13);
        fVar20 = ((float)puVar10[uVar16] + (float)uVar2) * 0.5;
        fVar22 = ((float)((ulong)puVar10[uVar16] >> 0x20) + (float)((ulong)uVar2 >> 0x20)) * 0.5;
        fVar24 = fVar20 * fVar20 + fVar22 * fVar22;
        fVar23 = 0.5;
        if (0.5 <= fVar24) {
          fVar23 = fVar24;
        }
        fVar20 = (1.0 / fVar23) * fVar20;
        fVar22 = (1.0 / fVar23) * fVar22;
        fVar23 = points[uVar16].x;
        fVar24 = points[uVar16].y;
        pfVar8 = pfVar8 + (ulong)(uint)((int)uVar16 * 2) * 2;
        *pfVar8 = fVar20 + fVar23;
        pfVar8[1] = fVar22 + fVar24;
        pfVar8[2] = fVar23 - fVar20;
        pfVar8[3] = fVar24 - fVar22;
        *puVar17 = uVar19;
        puVar17[1] = uVar18;
        puVar17[2] = uVar18 + 2;
        puVar17[3] = uVar18 + 2;
        puVar17[4] = uVar19 + 2;
        puVar17[5] = uVar19;
        puVar17[6] = uVar19 + 1;
        puVar17[7] = uVar18 + 1;
        puVar17[8] = uVar18;
        puVar17[9] = uVar18;
        puVar17[10] = uVar19;
        puVar17[0xb] = uVar19 + 1;
        puVar17 = puVar17 + 0xc;
        this->_IdxWritePtr = puVar17;
        pfVar8 = local_40;
        uVar18 = uVar19;
      }
      for (lVar13 = 0; uVar7 * 8 - lVar13 != 0; lVar13 = lVar13 + 8) {
        this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar13);
        this->_VtxWritePtr->uv = IVar3;
        pIVar4 = this->_VtxWritePtr;
        pIVar4->col = col;
        pIVar4[1].pos = *(ImVec2 *)((long)puVar10 + lVar13 * 2 + uVar7 * 8);
        this->_VtxWritePtr[1].uv = IVar3;
        pIVar4 = this->_VtxWritePtr;
        pIVar4[1].col = (ImU32)local_48;
        pIVar4[2].pos = *(ImVec2 *)((long)puVar10 + lVar13 * 2 + uVar7 * 8 + 8);
        this->_VtxWritePtr[2].uv = IVar3;
        pIVar4 = this->_VtxWritePtr;
        pIVar4[2].col = (ImU32)local_48;
        this->_VtxWritePtr = pIVar4 + 3;
      }
      goto LAB_0014c67c;
    }
    local_34 = col;
    fVar28 = (local_68.x + -1.0) * 0.5;
    fVar23 = fVar28 + 1.0;
  }
  uVar18 = this->_VtxCurrentIdx;
  puVar17 = this->_IdxWritePtr;
  *(undefined8 *)((long)&uStack_70 + lVar13) = 1;
  for (uVar9 = *(ulong *)((long)&uStack_70 + lVar13); lVar12 + uVar9 != 1; uVar9 = uVar9 + 1) {
    uVar16 = uVar9 & 0xffffffff;
    if (uVar7 == uVar9) {
      uVar16 = 0;
    }
    uVar19 = uVar18 + 4;
    if (uVar7 == uVar9) {
      uVar19 = this->_VtxCurrentIdx;
    }
    uVar2 = *(undefined8 *)((long)&uStack_70 + uVar9 * 8 + lVar13);
    fVar22 = ((float)puVar10[uVar16] + (float)uVar2) * 0.5;
    fVar24 = ((float)((ulong)puVar10[uVar16] >> 0x20) + (float)((ulong)uVar2 >> 0x20)) * 0.5;
    fVar21 = fVar22 * fVar22 + fVar24 * fVar24;
    fVar20 = 0.5;
    if (0.5 <= fVar21) {
      fVar20 = fVar21;
    }
    fVar20 = 1.0 / fVar20;
    fVar26 = points[uVar16].x;
    fVar27 = points[uVar16].y;
    uVar16 = (ulong)(uint)((int)uVar16 << 2);
    fVar21 = fVar22 * fVar20 * fVar23;
    fVar25 = fVar24 * fVar20 * fVar23;
    fVar22 = fVar22 * fVar20 * fVar28;
    fVar20 = fVar24 * fVar20 * fVar28;
    pfVar8 = local_40 + uVar16 * 2;
    *pfVar8 = fVar26 + fVar21;
    pfVar8[1] = fVar27 + fVar25;
    pfVar8[2] = fVar26 + fVar22;
    pfVar8[3] = fVar27 + fVar20;
    pfVar8 = local_40 + uVar16 * 2 + 4;
    *pfVar8 = fVar26 - fVar22;
    pfVar8[1] = fVar27 - fVar20;
    pfVar8[2] = fVar26 - fVar21;
    pfVar8[3] = fVar27 - fVar25;
    uVar15 = uVar19 + 1;
    *puVar17 = uVar15;
    puVar17[1] = uVar18 + 1;
    uVar1 = uVar18 + 2;
    puVar17[2] = uVar1;
    puVar17[3] = uVar1;
    uVar11 = uVar19 + 2;
    puVar17[4] = uVar11;
    puVar17[5] = uVar15;
    puVar17[6] = uVar15;
    puVar17[7] = uVar18 + 1;
    puVar17[8] = uVar18;
    puVar17[9] = uVar18;
    puVar17[10] = uVar19;
    puVar17[0xb] = uVar15;
    puVar17[0xc] = uVar11;
    puVar17[0xd] = uVar1;
    puVar17[0xe] = uVar18 + 3;
    puVar17[0xf] = uVar18 + 3;
    puVar17[0x10] = uVar19 + 3;
    puVar17[0x11] = uVar11;
    puVar17 = puVar17 + 0x12;
    this->_IdxWritePtr = puVar17;
    uVar18 = uVar19;
  }
  for (lVar13 = 0; uVar7 * 0x20 != lVar13; lVar13 = lVar13 + 0x20) {
    this->_VtxWritePtr->pos = *(ImVec2 *)((long)puVar10 + lVar13 + uVar7 * 8);
    this->_VtxWritePtr->uv = IVar3;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = (ImU32)local_48;
    pIVar4[1].pos = *(ImVec2 *)((long)puVar10 + lVar13 + uVar7 * 8 + 8);
    this->_VtxWritePtr[1].uv = IVar3;
    pIVar4 = this->_VtxWritePtr;
    pIVar4[1].col = local_34;
    pIVar4[2].pos = *(ImVec2 *)((long)puVar10 + lVar13 + uVar7 * 8 + 0x10);
    this->_VtxWritePtr[2].uv = IVar3;
    pIVar4 = this->_VtxWritePtr;
    pIVar4[2].col = local_34;
    pIVar4[3].pos = *(ImVec2 *)((long)puVar10 + lVar13 + uVar7 * 8 + 0x18);
    this->_VtxWritePtr[3].uv = IVar3;
    pIVar4 = this->_VtxWritePtr;
    pIVar4[3].col = (ImU32)local_48;
    this->_VtxWritePtr = pIVar4 + 4;
  }
LAB_0014c67c:
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + (int)IStack_50.y;
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    int count = points_count;
    if (!closed)
        count = points_count-1;

    const bool thick_line = (thickness > 1.0f);
    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        const int idx_count = thick_line ? count*18 : count*12;
        const int vtx_count = thick_line ? points_count*4 : points_count*3;
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * (thick_line ? 5 : 3) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count-1] = temp_normals[points_count-2];

        if (!thick_line)
        {
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * AA_SIZE;
                temp_points[1] = points[0] - temp_normals[0] * AA_SIZE;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * AA_SIZE;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * AA_SIZE;
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+3;

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= AA_SIZE;
                dm_y *= AA_SIZE;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2*2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                // Add indexes
                _IdxWritePtr[0] = (ImDrawIdx)(idx2+0); _IdxWritePtr[1] = (ImDrawIdx)(idx1+0); _IdxWritePtr[2] = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3] = (ImDrawIdx)(idx1+2); _IdxWritePtr[4] = (ImDrawIdx)(idx2+2); _IdxWritePtr[5] = (ImDrawIdx)(idx2+0);
                _IdxWritePtr[6] = (ImDrawIdx)(idx2+1); _IdxWritePtr[7] = (ImDrawIdx)(idx1+1); _IdxWritePtr[8] = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9] = (ImDrawIdx)(idx1+0); _IdxWritePtr[10]= (ImDrawIdx)(idx2+0); _IdxWritePtr[11]= (ImDrawIdx)(idx2+1);
                _IdxWritePtr += 12;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = points[i];          _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
                _VtxWritePtr[1].pos = temp_points[i*2+0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans;
                _VtxWritePtr[2].pos = temp_points[i*2+1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr += 3;
            }
        }
        else
        {
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2*4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Stroke
        const int idx_count = count*6;
        const int vtx_count = count*4;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}